

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

opj_image_t * pgxtoimage(char *filename,opj_cparameters_t *parameters)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  uchar uVar5;
  unsigned_short uVar6;
  int iVar7;
  uint uVar8;
  OPJ_UINT32 *pOVar9;
  OPJ_UINT32 local_f4;
  OPJ_UINT32 local_f0;
  uint local_ec;
  int v;
  opj_image_comp_t *comp;
  undefined1 local_d8 [4];
  int bigendian;
  char temp [32];
  char signtmp [32];
  byte bStack_8c;
  char sign;
  char endian2;
  char endian1;
  int force8;
  int dshift;
  int ushift;
  int adjustS;
  opj_image_t *image;
  opj_image_cmptparm_t cmptparm;
  OPJ_COLOR_SPACE color_space;
  int max;
  int numcomps;
  int i;
  int prec;
  int h;
  int w;
  FILE *f;
  opj_cparameters_t *parameters_local;
  char *filename_local;
  
  _h = (FILE *)0x0;
  cmptparm.bpp = 2;
  f = (FILE *)parameters;
  parameters_local = (opj_cparameters_t *)filename;
  memset(&image,0,0x24);
  cmptparm.sgnd = 0;
  _h = fopen((char *)parameters_local,"rb");
  if (_h == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !\n",parameters_local);
    filename_local = (char *)0x0;
  }
  else {
    fseek(_h,0,0);
    iVar7 = __isoc99_fscanf(_h,"PG%[ \t]%c%c%[ \t+-]%d%[ \t]%d%[ \t]%d",local_d8,signtmp + 0x1f,
                            signtmp + 0x1e,temp + 0x18,&numcomps,local_d8,&prec,local_d8,&i);
    if (iVar7 == 9) {
      max = 0;
      signtmp[0x1d] = '+';
      while (temp[(long)max + 0x18] != '\0') {
        if (temp[(long)max + 0x18] == '-') {
          signtmp[0x1d] = '-';
        }
        max = max + 1;
      }
      fgetc(_h);
      if ((signtmp[0x1f] == 'M') && (signtmp[0x1e] == 'L')) {
        comp._4_4_ = 1;
      }
      else {
        if ((signtmp[0x1e] != 'M') || (signtmp[0x1f] != 'L')) {
          fclose(_h);
          fprintf(_stderr,"Bad pgx header, please check input file\n");
          return (opj_image_t *)0x0;
        }
        comp._4_4_ = 0;
      }
      cmptparm.w = *(OPJ_UINT32 *)((long)&f[0x54]._IO_write_ptr + 4);
      cmptparm.h = *(OPJ_UINT32 *)&f[0x54]._IO_write_end;
      if (cmptparm.w == 0) {
        iVar7 = (prec + -1) * *(int *)((long)&f[0x54]._IO_write_end + 4);
      }
      else {
        iVar7 = cmptparm.w + (prec + -1) * *(int *)((long)&f[0x54]._IO_write_end + 4);
      }
      local_f0 = iVar7 + 1;
      cmptparm.dx = local_f0;
      if (cmptparm.h == 0) {
        iVar7 = (i + -1) * *(int *)&f[0x54]._IO_buf_base;
      }
      else {
        iVar7 = cmptparm.h + (i + -1) * *(int *)&f[0x54]._IO_buf_base;
      }
      local_f4 = iVar7 + 1;
      cmptparm.dy = local_f4;
      cmptparm.prec = (OPJ_UINT32)(signtmp[0x1d] == '-');
      if (numcomps < 8) {
        bVar2 = true;
        cVar3 = (char)numcomps;
        force8._0_1_ = 8 - cVar3;
        bStack_8c = cVar3 - (byte)force8;
        if (cmptparm.prec == 0) {
          dshift = 0;
        }
        else {
          dshift = 1 << (cVar3 - 1U & 0x1f);
        }
        cmptparm.prec = 0;
        numcomps = 8;
      }
      else {
        dshift = 0;
        bVar2 = false;
        bStack_8c = 0;
        force8._0_1_ = 0;
      }
      cmptparm.x0 = numcomps;
      cmptparm.y0 = numcomps;
      image._0_4_ = *(undefined4 *)((long)&f[0x54]._IO_write_end + 4);
      image._4_4_ = *(undefined4 *)&f[0x54]._IO_buf_base;
      pOVar9 = (OPJ_UINT32 *)opj_image_create(1,&image,cmptparm.bpp);
      if (pOVar9 == (OPJ_UINT32 *)0x0) {
        fclose(_h);
        filename_local = (char *)0x0;
      }
      else {
        *pOVar9 = cmptparm.w;
        pOVar9[1] = cmptparm.w;
        pOVar9[2] = cmptparm.dx;
        pOVar9[3] = cmptparm.dy;
        lVar1 = *(long *)(pOVar9 + 6);
        for (max = 0; max < prec * i; max = max + 1) {
          if (bVar2) {
            bVar4 = readuchar((FILE *)_h);
            uVar8 = ((uint)bVar4 + dshift << ((byte)force8 & 0x1f)) +
                    ((int)((uint)bVar4 + dshift) >> (bStack_8c & 0x1f));
            *(uint *)(*(long *)(lVar1 + 0x30) + (long)max * 4) = uVar8 & 0xff;
            if ((int)cmptparm.sgnd < (int)uVar8) {
              cmptparm.sgnd = uVar8;
            }
          }
          else {
            if (*(int *)(lVar1 + 0x18) == 8) {
              if (*(int *)(lVar1 + 0x20) == 0) {
                bVar4 = readuchar((FILE *)_h);
                local_ec = (uint)bVar4;
              }
              else {
                uVar5 = readuchar((FILE *)_h);
                local_ec = (uint)(char)uVar5;
              }
            }
            else if (*(uint *)(lVar1 + 0x18) < 0x11) {
              if (*(int *)(lVar1 + 0x20) == 0) {
                uVar6 = readushort((FILE *)_h,comp._4_4_);
                local_ec = (uint)uVar6;
              }
              else {
                uVar6 = readushort((FILE *)_h,comp._4_4_);
                local_ec = (uint)(short)uVar6;
              }
            }
            else if (*(int *)(lVar1 + 0x20) == 0) {
              local_ec = readuint((FILE *)_h,comp._4_4_);
            }
            else {
              local_ec = readuint((FILE *)_h,comp._4_4_);
            }
            if ((int)cmptparm.sgnd < (int)local_ec) {
              cmptparm.sgnd = local_ec;
            }
            *(uint *)(*(long *)(lVar1 + 0x30) + (long)max * 4) = local_ec;
          }
        }
        fclose(_h);
        iVar7 = int_floorlog2(cmptparm.sgnd);
        *(int *)(lVar1 + 0x1c) = iVar7 + 1;
        filename_local = (char *)pOVar9;
      }
    }
    else {
      fclose(_h);
      fprintf(_stderr,
              "ERROR: Failed to read the right number of element from the fscanf() function!\n");
      filename_local = (char *)0x0;
    }
  }
  return (opj_image_t *)filename_local;
}

Assistant:

opj_image_t* pgxtoimage(const char *filename, opj_cparameters_t *parameters) {
    FILE *f = NULL;
    int w, h, prec;
    int i, numcomps, max;
    OPJ_COLOR_SPACE color_space;
    opj_image_cmptparm_t cmptparm;	/* maximum of 1 component  */
    opj_image_t * image = NULL;
    int adjustS, ushift, dshift, force8;

    char endian1,endian2,sign;
    char signtmp[32];

    char temp[32];
    int bigendian;
    opj_image_comp_t *comp = NULL;

    numcomps = 1;
    color_space = OPJ_CLRSPC_GRAY;

    memset(&cmptparm, 0, sizeof(opj_image_cmptparm_t));

    max = 0;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !\n", filename);
        return NULL;
    }

    fseek(f, 0, SEEK_SET);
    if( fscanf(f, "PG%[ \t]%c%c%[ \t+-]%d%[ \t]%d%[ \t]%d",temp,&endian1,&endian2,signtmp,&prec,temp,&w,temp,&h) != 9){
        fclose(f);
        fprintf(stderr, "ERROR: Failed to read the right number of element from the fscanf() function!\n");
        return NULL;
    }

    i=0;
    sign='+';
    while (signtmp[i]!='\0') {
        if (signtmp[i]=='-') sign='-';
        i++;
    }

    fgetc(f);
    if (endian1=='M' && endian2=='L') {
        bigendian = 1;
    } else if (endian2=='M' && endian1=='L') {
        bigendian = 0;
    } else {
        fclose(f);
        fprintf(stderr, "Bad pgx header, please check input file\n");
        return NULL;
    }

    /* initialize image component */

    cmptparm.x0 = (OPJ_UINT32)parameters->image_offset_x0;
    cmptparm.y0 = (OPJ_UINT32)parameters->image_offset_y0;
    cmptparm.w = !cmptparm.x0 ? (OPJ_UINT32)((w - 1) * parameters->subsampling_dx + 1) : cmptparm.x0 + (OPJ_UINT32)(w - 1) * (OPJ_UINT32)parameters->subsampling_dx + 1;
    cmptparm.h = !cmptparm.y0 ? (OPJ_UINT32)((h - 1) * parameters->subsampling_dy + 1) : cmptparm.y0 + (OPJ_UINT32)(h - 1) * (OPJ_UINT32)parameters->subsampling_dy + 1;

    if (sign == '-') {
        cmptparm.sgnd = 1;
    } else {
        cmptparm.sgnd = 0;
    }
    if(prec < 8)
    {
        force8 = 1;
        ushift = 8 - prec; dshift = prec - ushift;
        if(cmptparm.sgnd) adjustS = (1<<(prec - 1)); else adjustS = 0;
        cmptparm.sgnd = 0;
        prec = 8;
    }
    else ushift = dshift = force8 = adjustS = 0;

    cmptparm.prec = (OPJ_UINT32)prec;
    cmptparm.bpp = (OPJ_UINT32)prec;
    cmptparm.dx = (OPJ_UINT32)parameters->subsampling_dx;
    cmptparm.dy = (OPJ_UINT32)parameters->subsampling_dy;

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm, color_space);
    if(!image) {
        fclose(f);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = cmptparm.x0;
    image->y0 = cmptparm.x0;
    image->x1 = cmptparm.w;
    image->y1 = cmptparm.h;

    /* set image data */

    comp = &image->comps[0];

    for (i = 0; i < w * h; i++) {
        int v;
        if(force8)
        {
            v = readuchar(f) + adjustS;
            v = (v<<ushift) + (v>>dshift);
            comp->data[i] = (unsigned char)v;

            if(v > max) max = v;

            continue;
        }
        if (comp->prec == 8) {
            if (!comp->sgnd) {
                v = readuchar(f);
            } else {
                v = (char) readuchar(f);
            }
        } else if (comp->prec <= 16) {
            if (!comp->sgnd) {
                v = readushort(f, bigendian);
            } else {
                v = (short) readushort(f, bigendian);
            }
        } else {
            if (!comp->sgnd) {
                v = (int)readuint(f, bigendian);
            } else {
                v = (int) readuint(f, bigendian);
            }
        }
        if (v > max)
            max = v;
        comp->data[i] = v;
    }
    fclose(f);
    comp->bpp = (OPJ_UINT32)int_floorlog2(max) + 1;

    return image;
}